

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_Compound(JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 *pcVar4;
  CompoundString *this_00;
  char16_t *pcVar5;
  
  bVar2 = VarIsImpl<Js::CompoundString>(&this->super_RecyclableObject);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1be,"(VarIs<CompoundString>(this))","VarIs<CompoundString>(this)"
                               );
    if (!bVar2) goto LAB_00d20c0d;
    *puVar3 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1bf,"(pstRight)","pstRight");
    if (!bVar2) {
LAB_00d20c0d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  StringProfiler::RecordConcatenation
            ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,this->m_charLength,
             pstRight->m_charLength,ConcatType_CompoundString);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
  if (bVar2) {
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar4 = L"";
    }
    else {
      pcVar4 = GetString(pstRight);
    }
    if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
      pcVar5 = L"...";
    }
    else {
      pcVar5 = L"";
      if (8 < pstRight->m_charLength) {
        pcVar5 = L"...";
      }
    }
    Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - appending to CompoundString\n"
                  ,pcVar4,pcVar5);
    Output::Flush();
  }
  this_00 = VarTo<Js::CompoundString,Js::JavascriptString>(this);
  CompoundString::PrepareForAppend(this_00);
  CompoundString::Append(this_00,pstRight);
  return this;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_Compound(JavascriptString* pstRight)
    {
        Assert(VarIs<CompoundString>(this));
        Assert(pstRight);

#ifdef PROFILE_STRINGS
        StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
        if(PHASE_TRACE_StringConcat)
        {
            Output::Print(
                _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - appending to CompoundString\n"),
                pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
            Output::Flush();
        }

        CompoundString *const leftCs = VarTo<CompoundString>(this);
        leftCs->PrepareForAppend();
        leftCs->Append(pstRight);
        return this;
    }